

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileGate.cpp
# Opt level: O0

bool __thiscall TileGate::updateNextState(TileGate *this)

{
  uint uVar1;
  State SVar2;
  Vector2u *pVVar3;
  Board *pBVar4;
  Tile *pTVar5;
  TileGate *in_RDI;
  int i;
  int numMiddle;
  int numHigh;
  int numInputs;
  State adjacentStates [4];
  int local_98;
  int local_84;
  int local_6c;
  State local_54;
  Direction local_48;
  int local_44;
  int local_40;
  int local_3c;
  Vector2<unsigned_int> local_38;
  Vector2<unsigned_int> local_30;
  Vector2<unsigned_int> local_28;
  Vector2<unsigned_int> local_20;
  State local_18 [6];
  
  pVVar3 = Tile::getPosition(&in_RDI->super_Tile);
  if (pVVar3->y == 0) {
    local_54 = DISCONNECTED;
  }
  else {
    pBVar4 = Tile::getBoardPtr(&in_RDI->super_Tile);
    pVVar3 = Tile::getPosition(&in_RDI->super_Tile);
    uVar1 = pVVar3->x;
    pVVar3 = Tile::getPosition(&in_RDI->super_Tile);
    sf::Vector2<unsigned_int>::Vector2(&local_20,uVar1,pVVar3->y - 1);
    pTVar5 = Board::getTile(pBVar4,&local_20);
    local_54 = (*pTVar5->_vptr_Tile[7])(pTVar5,0);
  }
  local_18[0] = local_54;
  pVVar3 = Tile::getPosition(&in_RDI->super_Tile);
  uVar1 = pVVar3->x;
  pBVar4 = Tile::getBoardPtr(&in_RDI->super_Tile);
  pVVar3 = Board::getSize(pBVar4);
  if (uVar1 < pVVar3->x - 1) {
    pBVar4 = Tile::getBoardPtr(&in_RDI->super_Tile);
    pVVar3 = Tile::getPosition(&in_RDI->super_Tile);
    uVar1 = pVVar3->x;
    pVVar3 = Tile::getPosition(&in_RDI->super_Tile);
    sf::Vector2<unsigned_int>::Vector2(&local_28,uVar1 + 1,pVVar3->y);
    pTVar5 = Board::getTile(pBVar4,&local_28);
    local_6c = (*pTVar5->_vptr_Tile[7])(pTVar5,1);
  }
  else {
    local_6c = 0;
  }
  local_18[1] = local_6c;
  pVVar3 = Tile::getPosition(&in_RDI->super_Tile);
  uVar1 = pVVar3->y;
  pBVar4 = Tile::getBoardPtr(&in_RDI->super_Tile);
  pVVar3 = Board::getSize(pBVar4);
  if (uVar1 < pVVar3->y - 1) {
    pBVar4 = Tile::getBoardPtr(&in_RDI->super_Tile);
    pVVar3 = Tile::getPosition(&in_RDI->super_Tile);
    uVar1 = pVVar3->x;
    pVVar3 = Tile::getPosition(&in_RDI->super_Tile);
    sf::Vector2<unsigned_int>::Vector2(&local_30,uVar1,pVVar3->y + 1);
    pTVar5 = Board::getTile(pBVar4,&local_30);
    local_84 = (*pTVar5->_vptr_Tile[7])(pTVar5,2);
  }
  else {
    local_84 = 0;
  }
  local_18[2] = local_84;
  pVVar3 = Tile::getPosition(&in_RDI->super_Tile);
  if (pVVar3->x == 0) {
    local_98 = 0;
  }
  else {
    pBVar4 = Tile::getBoardPtr(&in_RDI->super_Tile);
    pVVar3 = Tile::getPosition(&in_RDI->super_Tile);
    uVar1 = pVVar3->x;
    pVVar3 = Tile::getPosition(&in_RDI->super_Tile);
    sf::Vector2<unsigned_int>::Vector2(&local_38,uVar1 - 1,pVVar3->y);
    pTVar5 = Board::getTile(pBVar4,&local_38);
    local_98 = (*pTVar5->_vptr_Tile[7])(pTVar5,3);
  }
  local_18[3] = local_98;
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  for (local_48 = NORTH; (int)local_48 < 4; local_48 = local_48 + EAST) {
    if ((local_48 != (in_RDI->super_Tile)._direction) && (local_18[(int)local_48] != DISCONNECTED))
    {
      local_3c = local_3c + 1;
      if (local_18[(int)local_48] == HIGH) {
        local_40 = local_40 + 1;
      }
      else if (local_18[(int)local_48] == MIDDLE) {
        local_44 = local_44 + 1;
      }
    }
  }
  if ((Board::enableExtraLogicStates & 1U) == 0) {
    local_44 = 0;
  }
  if ((in_RDI->_connectorChange & 1U) != 0) {
    in_RDI->_rightConnector =
         local_18[(int)((in_RDI->super_Tile)._direction + EAST) % 4] != DISCONNECTED;
    in_RDI->_leftConnector =
         local_18[(int)((in_RDI->super_Tile)._direction + WEST) % 4] != DISCONNECTED;
    if (((*(int *)&(in_RDI->super_Tile).field_0x24 < 3) && ((in_RDI->_rightConnector & 1U) != 0)) &&
       ((in_RDI->_leftConnector & 1U) != 0)) {
      in_RDI->_rightConnector = false;
      in_RDI->_leftConnector = false;
    }
    in_RDI->_connectorChange = false;
    (*(in_RDI->super_Tile)._vptr_Tile[8])(in_RDI,1,0);
  }
  if (*(int *)&(in_RDI->super_Tile).field_0x24 == 0) {
    if (local_3c == 1) {
      if (local_40 == 1) {
        in_RDI->_nextState = HIGH;
      }
      else if (local_44 == 1) {
        in_RDI->_nextState = MIDDLE;
      }
      else {
        in_RDI->_nextState = LOW;
      }
    }
    else {
      in_RDI->_nextState = LOW;
    }
  }
  else if (*(int *)&(in_RDI->super_Tile).field_0x24 == 1) {
    SVar2 = _findNextStateBuffer(in_RDI,local_18,local_3c,local_40,local_44);
    in_RDI->_nextState = SVar2;
  }
  else if (*(int *)&(in_RDI->super_Tile).field_0x24 == 2) {
    SVar2 = _findNextStateBuffer(in_RDI,local_18,local_3c,local_40,local_44);
    SVar2 = _complementState(in_RDI,SVar2);
    in_RDI->_nextState = SVar2;
  }
  else if (*(int *)&(in_RDI->super_Tile).field_0x24 == 3) {
    SVar2 = _findNextStateAND(in_RDI,local_18,local_3c,local_40,local_44);
    in_RDI->_nextState = SVar2;
  }
  else if (*(int *)&(in_RDI->super_Tile).field_0x24 == 4) {
    SVar2 = _findNextStateAND(in_RDI,local_18,local_3c,local_40,local_44);
    SVar2 = _complementState(in_RDI,SVar2);
    in_RDI->_nextState = SVar2;
  }
  else if (*(int *)&(in_RDI->super_Tile).field_0x24 == 5) {
    SVar2 = _findNextStateOR(in_RDI,local_18,local_3c,local_40,local_44);
    in_RDI->_nextState = SVar2;
  }
  else if (*(int *)&(in_RDI->super_Tile).field_0x24 == 6) {
    SVar2 = _findNextStateOR(in_RDI,local_18,local_3c,local_40,local_44);
    SVar2 = _complementState(in_RDI,SVar2);
    in_RDI->_nextState = SVar2;
  }
  else if (*(int *)&(in_RDI->super_Tile).field_0x24 == 7) {
    SVar2 = _findNextStateXOR(in_RDI,local_18,local_3c,local_40,local_44);
    in_RDI->_nextState = SVar2;
  }
  else if (*(int *)&(in_RDI->super_Tile).field_0x24 == 8) {
    SVar2 = _findNextStateXOR(in_RDI,local_18,local_3c,local_40,local_44);
    SVar2 = _complementState(in_RDI,SVar2);
    in_RDI->_nextState = SVar2;
  }
  return in_RDI->_nextState != in_RDI->_state;
}

Assistant:

bool TileGate::updateNextState() {
    State adjacentStates[4];
    adjacentStates[0] = getPosition().y > 0 ? getBoardPtr()->getTile(Vector2u(getPosition().x, getPosition().y - 1))->checkOutput(NORTH) : DISCONNECTED;
    adjacentStates[1] = getPosition().x < getBoardPtr()->getSize().x - 1 ? getBoardPtr()->getTile(Vector2u(getPosition().x + 1, getPosition().y))->checkOutput(EAST) : DISCONNECTED;
    adjacentStates[2] = getPosition().y < getBoardPtr()->getSize().y - 1 ? getBoardPtr()->getTile(Vector2u(getPosition().x, getPosition().y + 1))->checkOutput(SOUTH) : DISCONNECTED;
    adjacentStates[3] = getPosition().x > 0 ? getBoardPtr()->getTile(Vector2u(getPosition().x - 1, getPosition().y))->checkOutput(WEST) : DISCONNECTED;
    
    int numInputs = 0, numHigh = 0, numMiddle = 0;
    for (int i = 0; i < 4; ++i) {
        if (i != _direction && adjacentStates[i] != DISCONNECTED) {
            ++numInputs;
            if (adjacentStates[i] == HIGH) {
                ++numHigh;
            } else if (adjacentStates[i] == MIDDLE) {
                ++numMiddle;
            }
        }
    }
    if (!Board::enableExtraLogicStates) {
        numMiddle = 0;
    }
    if (_connectorChange) {
        _rightConnector = (adjacentStates[(_direction + 1) % 4] != DISCONNECTED);
        _leftConnector = (adjacentStates[(_direction + 3) % 4] != DISCONNECTED);
        if (_type < AND && _rightConnector && _leftConnector) {
            _rightConnector = false;
            _leftConnector = false;
        }
        _connectorChange = false;
        addUpdate(true);
    }
    
    if (_type == DIODE) {
        if (numInputs == 1) {
            if (numHigh == 1) {
                _nextState = HIGH;
            } else if (numMiddle == 1) {
                _nextState = MIDDLE;
            } else {
                _nextState = LOW;
            }
        } else {
            _nextState = LOW;
        }
    } else if (_type == BUFFER) {
        _nextState = _findNextStateBuffer(adjacentStates, numInputs, numHigh, numMiddle);
    } else if (_type == NOT) {
        _nextState = _complementState(_findNextStateBuffer(adjacentStates, numInputs, numHigh, numMiddle));
    } else if (_type == AND) {
        _nextState = _findNextStateAND(adjacentStates, numInputs, numHigh, numMiddle);
    } else if (_type == NAND) {
        _nextState = _complementState(_findNextStateAND(adjacentStates, numInputs, numHigh, numMiddle));
    } else if (_type == OR) {
        _nextState = _findNextStateOR(adjacentStates, numInputs, numHigh, numMiddle);
    } else if (_type == NOR) {
        _nextState = _complementState(_findNextStateOR(adjacentStates, numInputs, numHigh, numMiddle));
    } else if (_type == XOR) {
        _nextState = _findNextStateXOR(adjacentStates, numInputs, numHigh, numMiddle);
    } else if (_type == XNOR) {
        _nextState = _complementState(_findNextStateXOR(adjacentStates, numInputs, numHigh, numMiddle));
    }
    
    //cout << "Gate at (" << getPosition().x << ", " << getPosition().y << ") checked for state change:" << endl;
    //cout << "  aS = [" << adjacentStates[0] << ", " << adjacentStates[1] << ", " << adjacentStates[2] << ", " << adjacentStates[3] << "]" << endl;
    //cout << "  state = " << _state << ", next = " << _nextState << endl;
    
    return _nextState != _state;
}